

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O1

int luaB_cocreate(lua_State *L)

{
  lua_State *to;
  
  luaL_checktype(L,1,6);
  to = lua_newthread(L);
  lua_pushvalue(L,1);
  lua_xmove(L,to,1);
  return 1;
}

Assistant:

static int luaB_cocreate(lua_State *L) {
    lua_State *NL;
    luaL_checktype(L, 1, LUA_TFUNCTION);
    NL = lua_newthread(L);
    lua_pushvalue(L, 1);  /* move function to top */
    lua_xmove(L, NL, 1);  /* move function from L to NL */
    return 1;
}